

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_client.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *peVar3;
  unsigned_long uVar4;
  pointer puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  atomic_int active_clients;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  int concurrency;
  allocator local_1a9;
  __shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  atomic_int finished_clients;
  int msg_num;
  shared_ptr<Liby::TcpClient> echo_client;
  atomic_int connected_clients;
  unsigned_long bytesPerClients;
  undefined1 local_158 [32];
  vector<Liby::Connection_*,_std::allocator<Liby::Connection_*>_> conns;
  Timestamp start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bytes;
  vector<char,_std::allocator<char>_> buf;
  _Any_data local_e0;
  code *local_d0;
  code *local_c8;
  EventLoopGroup group;
  
  connected_clients.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  finished_clients.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  if (argc == 6) {
    iVar6 = atoi(argv[4]);
    msg_num = iVar6;
    iVar7 = atoi(argv[5]);
    iVar8 = atoi(argv[3]);
    active_clients.super___atomic_base<int>._M_i = (__atomic_base<int>)(__atomic_base<int>)iVar8;
    concurrency = iVar8;
  }
  else {
    if (argc != 7) {
      print_usage();
      return 1;
    }
    iVar6 = atoi(argv[5]);
    msg_num = iVar6;
    iVar7 = atoi(argv[6]);
    iVar8 = atoi(argv[3]);
    concurrency = iVar8;
    active_clients.super___atomic_base<int>._M_i = (__atomic_base<int>)atoi(argv[4]);
  }
  LOCK();
  UNLOCK();
  bytesPerClients = (unsigned_long)(iVar6 * iVar7);
  group.n_._0_1_ = 0x41;
  std::vector<char,_std::allocator<char>_>::vector
            (&buf,(long)iVar7,(value_type *)&group,(allocator_type *)local_1d8._M_pod_data);
  group.n_ = 0;
  group._4_4_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&bytes,(long)iVar8,(value_type_conflict1 *)&group,
             (allocator_type *)local_1d8._M_pod_data);
  conns.super__Vector_base<Liby::Connection_*,_std::allocator<Liby::Connection_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  conns.super__Vector_base<Liby::Connection_*,_std::allocator<Liby::Connection_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  conns.super__Vector_base<Liby::Connection_*,_std::allocator<Liby::Connection_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_1d8._M_pod_data,"EPOLL",(allocator *)local_158);
  Liby::EventLoopGroup::EventLoopGroup(&group,4,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)local_1d8._M_pod_data);
  Liby::Timestamp::now();
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < iVar8; lVar9 = lVar9 + 1) {
    std::__cxx11::string::string((string *)local_1d8._M_pod_data,argv[1],(allocator *)&local_1a8);
    std::__cxx11::string::string((string *)local_158,argv[2],&local_1a9);
    Liby::EventLoopGroup::creatTcpClient
              ((EventLoopGroup *)&echo_client,(string *)&group,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)local_1d8._M_pod_data);
    peVar3 = echo_client.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (lVar9 < (int)active_clients.super___atomic_base<int>._M_i) {
      local_158._0_8_ = 8;
      local_158._8_8_ = 0;
      std::__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1a8,
                 &echo_client.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>);
      local_1c8 = (code *)0x0;
      pcStack_1c0 = (code *)0x0;
      local_1d8._M_unused._M_object = (void *)0x0;
      local_1d8._8_8_ = 0;
      local_1d8._M_unused._M_object = operator_new(0x10);
      _Var2._M_pi = local_1a8._M_refcount._M_pi;
      peVar1 = local_1a8._M_ptr;
      local_1a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a8._M_ptr = (element_type *)0x0;
      *(element_type **)local_1d8._M_unused._0_8_ = peVar1;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_1d8._M_unused._0_8_ + 8) =
           _Var2._M_pi;
      pcStack_1c0 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:42:52)>
                    ::_M_invoke;
      local_1c8 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:42:52)>
                  ::_M_manager;
      Liby::TimerMixin::runAfter
                (&peVar3->super_TimerMixin,(Timestamp *)local_158,(BasicHandler *)&local_1d8);
      std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
      puVar5 = bytes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = bytesPerClients;
      peVar3 = echo_client.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1d8._M_unused._M_object = (void *)0x0;
      local_1d8._8_8_ = 0;
      local_1c8 = (code *)0x0;
      pcStack_1c0 = (code *)0x0;
      local_1d8._M_unused._M_object = operator_new(0x48);
      *(vector<char,_std::allocator<char>_> **)local_1d8._M_unused._0_8_ = &buf;
      *(long *)((long)local_1d8._M_unused._0_8_ + 8) = (long)puVar5 + lVar10;
      *(Timestamp **)((long)local_1d8._M_unused._0_8_ + 0x10) = &start;
      *(atomic_int **)((long)local_1d8._M_unused._0_8_ + 0x18) = &active_clients;
      *(vector<Liby::Connection_*,_std::allocator<Liby::Connection_*>_> **)
       ((long)local_1d8._M_unused._0_8_ + 0x20) = &conns;
      *(atomic_int **)((long)local_1d8._M_unused._0_8_ + 0x28) = &finished_clients;
      *(atomic_int **)((long)local_1d8._M_unused._0_8_ + 0x30) = &connected_clients;
      *(unsigned_long *)((long)local_1d8._M_unused._0_8_ + 0x38) = uVar4;
      *(EventLoopGroup **)((long)local_1d8._M_unused._0_8_ + 0x40) = &group;
      pcStack_1c0 = std::
                    _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:44:36)>
                    ::_M_invoke;
      local_1c8 = std::
                  _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:44:36)>
                  ::_M_manager;
      Liby::TcpClient::onConnect(peVar3,(Connector *)&local_1d8);
      std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
    }
    else {
      local_158._0_8_ = 1000;
      local_158._8_8_ = 0;
      std::__shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1a8,
                 &echo_client.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>);
      local_1c8 = (code *)0x0;
      pcStack_1c0 = (code *)0x0;
      local_1d8._M_unused._M_object = (void *)0x0;
      local_1d8._8_8_ = 0;
      local_1d8._M_unused._M_object = operator_new(0x10);
      _Var2._M_pi = local_1a8._M_refcount._M_pi;
      peVar1 = local_1a8._M_ptr;
      local_1a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a8._M_ptr = (element_type *)0x0;
      *(element_type **)local_1d8._M_unused._0_8_ = peVar1;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_1d8._M_unused._0_8_ + 8) =
           _Var2._M_pi;
      pcStack_1c0 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:99:55)>
                    ::_M_invoke;
      local_1c8 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:99:55)>
                  ::_M_manager;
      Liby::TimerMixin::runEvery
                (&peVar3->super_TimerMixin,(Timestamp *)local_158,(BasicHandler *)&local_1d8);
      std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&echo_client.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    lVar10 = lVar10 + 8;
    iVar8 = concurrency;
  }
  local_1c8 = (code *)0x0;
  pcStack_1c0 = (code *)0x0;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1d8._M_unused._M_object = operator_new(0x28);
  *(unsigned_long **)local_1d8._M_unused._0_8_ = &bytesPerClients;
  *(atomic_int **)((long)local_1d8._M_unused._0_8_ + 8) = &finished_clients;
  *(Timestamp **)((long)local_1d8._M_unused._0_8_ + 0x10) = &start;
  *(int **)((long)local_1d8._M_unused._0_8_ + 0x18) = &concurrency;
  *(int **)((long)local_1d8._M_unused._0_8_ + 0x20) = &msg_num;
  pcStack_1c0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:103:22)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:103:22)>
              ::_M_manager;
  Liby::ExitCaller::call((function<void_()> *)&local_1d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
  local_e0._8_8_ = 0;
  local_e0._M_unused._M_object = &active_clients;
  local_c8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:113:15)>
             ::_M_invoke;
  local_d0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo_client.cpp:113:15)>
             ::_M_manager;
  Liby::EventLoopGroup::run(&group,(BoolFunctor *)&local_e0);
  std::_Function_base::~_Function_base((_Function_base *)&local_e0);
  Liby::EventLoopGroup::~EventLoopGroup(&group);
  std::_Vector_base<Liby::Connection_*,_std::allocator<Liby::Connection_*>_>::~_Vector_base
            (&conns.super__Vector_base<Liby::Connection_*,_std::allocator<Liby::Connection_*>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&bytes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    //    Logger::setLevel(Logger::LogLevel::VERBOSE);
    int msg_num, msg_len, concurrency;
    atomic_int active_clients;
    atomic_int connected_clients(0);
    atomic_int finished_clients(0);
    if (argc == 7) {
        msg_num = ::atoi(argv[5]);
        msg_len = ::atoi(argv[6]);
        concurrency = ::atoi(argv[3]);
        active_clients = ::atoi(argv[4]);
    } else if (argc == 6) {
        msg_num = ::atoi(argv[4]);
        msg_len = ::atoi(argv[5]);
        active_clients = concurrency = ::atoi(argv[3]);
    } else {
        print_usage();
        return 1;
    }
    unsigned long bytesPerClients = msg_len * msg_num;

    vector<char> buf(msg_len, 'A');
    vector<unsigned long> bytes(concurrency, 0);
    vector<Connection *> conns;

    EventLoopGroup group(4, "EPOLL");
    auto start = Timestamp::now();
    for (int i = 0; i < concurrency; i++) {
        auto echo_client = group.creatTcpClient(argv[1], argv[2]);
        if (i < active_clients) {
            echo_client->runAfter(Timestamp(8, 0), [echo_client] {});
            unsigned long *pBytes = &bytes[i];
            echo_client->onConnect([&buf, pBytes, &start, &active_clients,
                                    &conns, &finished_clients,
                                    &connected_clients, bytesPerClients,
                                    &group](std::shared_ptr<Connection> conn) {
                if (!conn) {
                    return;
                }

                connected_clients++;
                conns.push_back(conn.get());
                if (connected_clients != active_clients) {
                    static int i = 0;
                    i++;
                    //                    info("%d", i);
                    conn->enableRead(false);
                } else {
                    start = Timestamp::now();
                    for (auto c : conns) {
                        c->runEventHandler([c, &buf] {
                            c->enableRead(true);
                            c->send(&buf[0], buf.size());
                        });
                    }
                }

                conn->onRead([&buf, pBytes, bytesPerClients, &active_clients,
                              &finished_clients, &group](Connection &c) {
                    *pBytes += c.read().size();
                    c.send(c.read());

                    info("herohahaha in loop %p",
                         EventLoop::curr_thread_loop());

                    if (*pBytes >= bytesPerClients) {
                        c.destroy();
                        group.robinLoop1(0)->runEventHandler(
                            [&active_clients, &finished_clients] {
                                finished_clients++;
                                if (--active_clients <= 0) {
                                    ::exit(0);
                                }
                            });
                    }
                });
                conn->onErro([&group, &active_clients](Connection &) {
                    group.robinLoop1(0)->runEventHandler([&active_clients] {
                        if (--active_clients <= 0) {
                            ::exit(0);
                        }
                    });
                });

                //                conn->send(&buf[0], buf.size());
            });
        } else {
            echo_client->runEvery(Timestamp(1000, 0), [echo_client] {});
        }
    }

    ExitCaller::call([&] {
        auto end = Timestamp::now();
        unsigned long totalBytes = bytesPerClients * finished_clients;
        info("总时间 %g 秒", (end - start).toSecF());
        info("totalBytes = %ld", totalBytes);
        info("速度 %lf MiB/s",
             totalBytes / (end - start).toSecF() / 1024 / 1024);
        info(" QPS %d", (int)(concurrency * msg_num / (end - start).toSecF()));
    });

    group.run([&active_clients] { return active_clients > 0; });

    return 0;
}